

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O0

uint32_t spvtools::opt::anon_unknown_0::PerformFloatingPointOperation
                   (ConstantManager *const_mgr,Op opcode,Constant *input1,Constant *input2)

{
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  Type *type_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Constant *c;
  Instruction *this;
  float fVar4;
  float fVar5;
  double dVar6;
  double dVar7;
  Constant *merged_const;
  float local_168;
  FloatProxy<float> local_164;
  float fval_3;
  FloatProxy<float> val_7;
  double dval_3;
  FloatProxy<double> val_6;
  FloatProxy<float> local_11c;
  float fval_2;
  FloatProxy<float> val_5;
  double dval_2;
  FloatProxy<double> val_4;
  FloatProxy<float> local_d4;
  float fval_1;
  FloatProxy<float> val_3;
  double dval_1;
  FloatProxy<double> val_2;
  FloatProxy<float> local_8c;
  float fval;
  FloatProxy<float> val_1;
  double dval;
  FloatProxy<double> val;
  vector<unsigned_int,_std::allocator<unsigned_int>_> words;
  uint32_t width;
  Type *type;
  Constant *input2_local;
  Constant *input1_local;
  Op opcode_local;
  ConstantManager *const_mgr_local;
  
  type_00 = analysis::Constant::type(input1);
  iVar2 = (*type_00->_vptr_Type[0xc])();
  if (CONCAT44(extraout_var,iVar2) == 0) {
    __assert_fail("type->AsFloat()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x229,
                  "uint32_t spvtools::opt::(anonymous namespace)::PerformFloatingPointOperation(analysis::ConstantManager *, spv::Op, const analysis::Constant *, const analysis::Constant *)"
                 );
  }
  iVar2 = (*type_00->_vptr_Type[0xc])();
  uVar3 = analysis::Float::width((Float *)CONCAT44(extraout_var_00,iVar2));
  if (uVar3 != 0x20 && uVar3 != 0x40) {
    __assert_fail("width == 32 || width == 64",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x22b,
                  "uint32_t spvtools::opt::(anonymous namespace)::PerformFloatingPointOperation(analysis::ConstantManager *, spv::Op, const analysis::Constant *, const analysis::Constant *)"
                 );
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&val);
  switch(opcode) {
  case OpFAdd:
    if (uVar3 == 0x40) {
      dVar6 = analysis::Constant::GetDouble(input1);
      dVar7 = analysis::Constant::GetDouble(input2);
      utils::FloatProxy<double>::FloatProxy((FloatProxy<double> *)&dval_2,dVar6 + dVar7);
      dVar6 = utils::FloatProxy<double>::getAsFloat((FloatProxy<double> *)&dval_2);
      bVar1 = IsValidResult<double>(dVar6);
      if (!bVar1) {
        const_mgr_local._4_4_ = 0;
        goto LAB_0037e615;
      }
      utils::FloatProxy<double>::GetWords
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&fval_2,
                 (FloatProxy<double> *)&dval_2);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&val,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&fval_2);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&fval_2);
    }
    else {
      fVar4 = analysis::Constant::GetFloat(input1);
      fVar5 = analysis::Constant::GetFloat(input2);
      utils::FloatProxy<float>::FloatProxy(&local_11c,fVar4 + fVar5);
      fVar4 = utils::FloatProxy<float>::getAsFloat(&local_11c);
      bVar1 = IsValidResult<float>(fVar4);
      if (!bVar1) {
        const_mgr_local._4_4_ = 0;
        goto LAB_0037e615;
      }
      utils::FloatProxy<float>::GetWords
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&val_6,&local_11c);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&val,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&val_6);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&val_6);
    }
    break;
  default:
    __assert_fail("false && \"Unexpected operation\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x24a,
                  "uint32_t spvtools::opt::(anonymous namespace)::PerformFloatingPointOperation(analysis::ConstantManager *, spv::Op, const analysis::Constant *, const analysis::Constant *)"
                 );
  case OpFSub:
    if (uVar3 == 0x40) {
      dVar6 = analysis::Constant::GetDouble(input1);
      dVar7 = analysis::Constant::GetDouble(input2);
      utils::FloatProxy<double>::FloatProxy((FloatProxy<double> *)&dval_3,dVar6 - dVar7);
      dVar6 = utils::FloatProxy<double>::getAsFloat((FloatProxy<double> *)&dval_3);
      bVar1 = IsValidResult<double>(dVar6);
      if (!bVar1) {
        const_mgr_local._4_4_ = 0;
        goto LAB_0037e615;
      }
      utils::FloatProxy<double>::GetWords
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&fval_3,
                 (FloatProxy<double> *)&dval_3);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&val,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&fval_3);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&fval_3);
    }
    else {
      fVar4 = analysis::Constant::GetFloat(input1);
      fVar5 = analysis::Constant::GetFloat(input2);
      utils::FloatProxy<float>::FloatProxy(&local_164,fVar4 - fVar5);
      local_168 = utils::FloatProxy<float>::getAsFloat(&local_164);
      bVar1 = IsValidResult<float>(local_168);
      if (!bVar1) {
        const_mgr_local._4_4_ = 0;
        goto LAB_0037e615;
      }
      utils::FloatProxy<float>::GetWords
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&merged_const,&local_164);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&val,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&merged_const);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&merged_const);
    }
    break;
  case OpFMul:
    if (uVar3 == 0x40) {
      dVar6 = analysis::Constant::GetDouble(input1);
      dVar7 = analysis::Constant::GetDouble(input2);
      utils::FloatProxy<double>::FloatProxy((FloatProxy<double> *)&dval,dVar6 * dVar7);
      dVar6 = utils::FloatProxy<double>::getAsFloat((FloatProxy<double> *)&dval);
      bVar1 = IsValidResult<double>(dVar6);
      if (!bVar1) {
        const_mgr_local._4_4_ = 0;
        goto LAB_0037e615;
      }
      utils::FloatProxy<double>::GetWords
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&fval,
                 (FloatProxy<double> *)&dval);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&val,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&fval);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&fval);
    }
    else {
      fVar4 = analysis::Constant::GetFloat(input1);
      fVar5 = analysis::Constant::GetFloat(input2);
      utils::FloatProxy<float>::FloatProxy(&local_8c,fVar4 * fVar5);
      fVar4 = utils::FloatProxy<float>::getAsFloat(&local_8c);
      bVar1 = IsValidResult<float>(fVar4);
      if (!bVar1) {
        const_mgr_local._4_4_ = 0;
        goto LAB_0037e615;
      }
      utils::FloatProxy<float>::GetWords
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&val_2,&local_8c);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&val,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&val_2);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&val_2);
    }
    break;
  case OpFDiv:
    bVar1 = HasZero(input2);
    if (bVar1) {
      const_mgr_local._4_4_ = 0;
      goto LAB_0037e615;
    }
    if (uVar3 == 0x40) {
      dVar6 = analysis::Constant::GetDouble(input1);
      dVar7 = analysis::Constant::GetDouble(input2);
      utils::FloatProxy<double>::FloatProxy((FloatProxy<double> *)&dval_1,dVar6 / dVar7);
      dVar6 = utils::FloatProxy<double>::getAsFloat((FloatProxy<double> *)&dval_1);
      bVar1 = IsValidResult<double>(dVar6);
      if (!bVar1) {
        const_mgr_local._4_4_ = 0;
        goto LAB_0037e615;
      }
      utils::FloatProxy<double>::GetWords
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&fval_1,
                 (FloatProxy<double> *)&dval_1);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&val,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&fval_1);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&fval_1);
    }
    else {
      fVar4 = analysis::Constant::GetFloat(input1);
      fVar5 = analysis::Constant::GetFloat(input2);
      utils::FloatProxy<float>::FloatProxy(&local_d4,fVar4 / fVar5);
      fVar4 = utils::FloatProxy<float>::getAsFloat(&local_d4);
      bVar1 = IsValidResult<float>(fVar4);
      if (!bVar1) {
        const_mgr_local._4_4_ = 0;
        goto LAB_0037e615;
      }
      utils::FloatProxy<float>::GetWords
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&val_4,&local_d4);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&val,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&val_4);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&val_4);
    }
  }
  c = analysis::ConstantManager::GetConstant
                (const_mgr,type_00,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&val);
  this = analysis::ConstantManager::GetDefiningInstruction(const_mgr,c,0,(inst_iterator *)0x0);
  const_mgr_local._4_4_ = Instruction::result_id(this);
LAB_0037e615:
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&val);
  return const_mgr_local._4_4_;
}

Assistant:

uint32_t PerformFloatingPointOperation(analysis::ConstantManager* const_mgr,
                                       spv::Op opcode,
                                       const analysis::Constant* input1,
                                       const analysis::Constant* input2) {
  const analysis::Type* type = input1->type();
  assert(type->AsFloat());
  uint32_t width = type->AsFloat()->width();
  assert(width == 32 || width == 64);
  std::vector<uint32_t> words;
#define FOLD_OP(op)                                                          \
  if (width == 64) {                                                         \
    utils::FloatProxy<double> val =                                          \
        input1->GetDouble() op input2->GetDouble();                          \
    double dval = val.getAsFloat();                                          \
    if (!IsValidResult(dval)) return 0;                                      \
    words = val.GetWords();                                                  \
  } else {                                                                   \
    utils::FloatProxy<float> val = input1->GetFloat() op input2->GetFloat(); \
    float fval = val.getAsFloat();                                           \
    if (!IsValidResult(fval)) return 0;                                      \
    words = val.GetWords();                                                  \
  }                                                                          \
  static_assert(true, "require extra semicolon")
  switch (opcode) {
    case spv::Op::OpFMul:
      FOLD_OP(*);
      break;
    case spv::Op::OpFDiv:
      if (HasZero(input2)) return 0;
      FOLD_OP(/);
      break;
    case spv::Op::OpFAdd:
      FOLD_OP(+);
      break;
    case spv::Op::OpFSub:
      FOLD_OP(-);
      break;
    default:
      assert(false && "Unexpected operation");
      break;
  }
#undef FOLD_OP
  const analysis::Constant* merged_const = const_mgr->GetConstant(type, words);
  return const_mgr->GetDefiningInstruction(merged_const)->result_id();
}